

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

_Bool nni_aio_sys_drain(void)

{
  _Bool _Var1;
  int local_10;
  _Bool local_9;
  int i;
  _Bool result;
  
  local_9 = false;
  for (local_10 = 0; local_10 < nni_aio_expire_q_cnt; local_10 = local_10 + 1) {
    _Var1 = nni_aio_expire_q_stop(nni_aio_expire_q_list[local_10]);
    if (_Var1) {
      local_9 = true;
    }
  }
  return local_9;
}

Assistant:

bool
nni_aio_sys_drain(void)
{
	bool result = false;
	for (int i = 0; i < nni_aio_expire_q_cnt; i++) {
		if (nni_aio_expire_q_stop(nni_aio_expire_q_list[i])) {
			result = true;
		}
	}
	return (result);
}